

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.hpp
# Opt level: O3

Uint32 __thiscall
Diligent::PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>::GetStaticVariableCount
          (PipelineResourceSignatureBase<Diligent::EngineGLImplTraits> *this,SHADER_TYPE ShaderType)

{
  char cVar1;
  ShaderVariableManagerImplType *pSVar2;
  bool bVar3;
  Int32 IVar4;
  uint uVar5;
  uint uVar6;
  string _msg;
  char *local_28;
  Char *local_20;
  
  bVar3 = IsConsistentShaderType(ShaderType,this->m_PipelineType);
  if (bVar3) {
    IVar4 = GetShaderTypePipelineIndex(ShaderType,this->m_PipelineType);
    cVar1 = (this->m_StaticResStageIndex)._M_elems[IVar4];
    uVar6 = (uint)cVar1;
    if (-1 < cVar1) {
      uVar5 = this->m_StaticResShaderStages - (this->m_StaticResShaderStages >> 1 & 0x55555555);
      uVar5 = (uVar5 >> 2 & 0x33333333) + (uVar5 & 0x33333333);
      uVar5 = (uVar5 >> 4) + uVar5 & 0xf0f0f0f;
      if (uVar5 * 0x1010101 >> 0x18 <= uVar6) {
        FormatString<char[26],char[58]>
                  (&_msg,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"static_cast<Uint32>(VarMngrInd) < GetNumStaticResStages()",
                   (char (*) [58])(ulong)uVar5);
        DebugAssertionFailed
                  (_msg._M_dataplus._M_p,"GetStaticVariableCount",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
                   ,0x1c9);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_msg._M_dataplus._M_p != &_msg.field_2) {
          operator_delete(_msg._M_dataplus._M_p,_msg.field_2._M_allocated_capacity + 1);
        }
      }
      pSVar2 = this->m_StaticVarsMgrs;
      return (int)(((ulong)pSVar2[uVar6].m_VariableEndOffset -
                   (ulong)pSVar2[uVar6].m_StorageBufferOffset) / 0x18) +
             (int)(((ulong)pSVar2[uVar6].m_StorageBufferOffset - (ulong)pSVar2[uVar6].m_ImageOffset)
                  / 0x18) +
             (int)(((ulong)pSVar2[uVar6].m_ImageOffset - (ulong)pSVar2[uVar6].m_TextureOffset) /
                  0x18) + pSVar2[uVar6].m_TextureOffset / 0x18;
    }
  }
  else {
    local_20 = GetShaderTypeLiteralName(ShaderType);
    local_28 = GetPipelineTypeString(this->m_PipelineType);
    FormatString<char[62],char_const*,char[30],char_const*,char[31],char_const*,char[3]>
              (&_msg,(Diligent *)"Unable to get the number of static variables in shader stage ",
               (char (*) [62])&local_20,(char **)" as the stage is invalid for ",
               (char (*) [30])&local_28,(char **)0x360434,
               (char (*) [31])
               &(this->
                super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
                ).m_Desc,(char **)"\'.",(char (*) [3])_msg._M_dataplus._M_p);
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(1,_msg._M_dataplus._M_p,0,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_msg._M_dataplus._M_p != &_msg.field_2) {
      operator_delete(_msg._M_dataplus._M_p,_msg.field_2._M_allocated_capacity + 1);
    }
  }
  return 0;
}

Assistant:

GetStaticVariableCount(SHADER_TYPE ShaderType) const override final
    {
        if (!IsConsistentShaderType(ShaderType, m_PipelineType))
        {
            LOG_WARNING_MESSAGE("Unable to get the number of static variables in shader stage ", GetShaderTypeLiteralName(ShaderType),
                                " as the stage is invalid for ", GetPipelineTypeString(m_PipelineType), " pipeline resource signature '", this->m_Desc.Name, "'.");
            return 0;
        }

        const Int32 ShaderTypeInd = GetShaderTypePipelineIndex(ShaderType, m_PipelineType);
        const int   VarMngrInd    = m_StaticResStageIndex[ShaderTypeInd];
        if (VarMngrInd < 0)
            return 0;

        VERIFY_EXPR(static_cast<Uint32>(VarMngrInd) < GetNumStaticResStages());
        return m_StaticVarsMgrs[VarMngrInd].GetVariableCount();
    }